

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void av1_highbd_iwht4x4_16_add_sse4_1(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  int iVar11;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar12 [16];
  int iVar16;
  int iVar20;
  int iVar21;
  undefined1 auVar17 [16];
  int iVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 auVar26 [16];
  __m128i alVar30;
  __m128i u;
  
  auVar17._0_4_ = *input >> 2;
  auVar17._4_4_ = input[1] >> 2;
  auVar17._8_4_ = input[2] >> 2;
  auVar17._12_4_ = input[3] >> 2;
  auVar24._0_4_ = input[4] >> 2;
  auVar24._4_4_ = input[5] >> 2;
  auVar24._8_4_ = input[6] >> 2;
  auVar24._12_4_ = input[7] >> 2;
  auVar6._0_4_ = input[8] >> 2;
  auVar6._4_4_ = input[9] >> 2;
  auVar6._8_4_ = input[10] >> 2;
  auVar6._12_4_ = input[0xb] >> 2;
  auVar12._0_4_ = input[0xc] >> 2;
  auVar12._4_4_ = input[0xd] >> 2;
  auVar12._8_4_ = input[0xe] >> 2;
  auVar12._12_4_ = input[0xf] >> 2;
  iVar2 = 2;
  while (iVar1 = iVar2 + -1, iVar2 != 0) {
    iVar25 = auVar24._0_4_;
    iVar16 = auVar17._0_4_ + iVar25;
    iVar27 = auVar24._4_4_;
    iVar20 = auVar17._4_4_ + iVar27;
    iVar28 = auVar24._8_4_;
    iVar21 = auVar17._8_4_ + iVar28;
    iVar29 = auVar24._12_4_;
    iVar22 = auVar17._12_4_ + iVar29;
    iVar11 = auVar6._0_4_ - auVar12._0_4_;
    iVar13 = auVar6._4_4_ - auVar12._4_4_;
    iVar14 = auVar6._8_4_ - auVar12._8_4_;
    iVar15 = auVar6._12_4_ - auVar12._12_4_;
    iVar5 = iVar16 - iVar11 >> 1;
    iVar8 = iVar20 - iVar13 >> 1;
    iVar9 = iVar21 - iVar14 >> 1;
    iVar10 = iVar22 - iVar15 >> 1;
    auVar24._0_4_ = iVar5 - auVar12._0_4_;
    auVar24._4_4_ = iVar8 - auVar12._4_4_;
    auVar24._8_4_ = iVar9 - auVar12._8_4_;
    auVar24._12_4_ = iVar10 - auVar12._12_4_;
    iVar5 = iVar5 - iVar25;
    iVar8 = iVar8 - iVar27;
    auVar6._0_8_ = CONCAT44(iVar8,iVar5);
    auVar6._8_4_ = iVar9 - iVar28;
    auVar6._12_4_ = iVar10 - iVar29;
    iVar16 = iVar16 - auVar24._0_4_;
    iVar20 = iVar20 - auVar24._4_4_;
    auVar18._0_8_ = CONCAT44(iVar20,iVar16);
    auVar18._8_4_ = iVar21 - auVar24._8_4_;
    auVar18._12_4_ = iVar22 - auVar24._12_4_;
    auVar12._0_4_ = iVar11 + iVar5;
    auVar12._4_4_ = iVar13 + iVar8;
    auVar12._8_4_ = iVar14 + auVar6._8_4_;
    auVar12._12_4_ = iVar15 + auVar6._12_4_;
    bVar4 = iVar2 == 2;
    auVar17 = auVar18;
    iVar2 = iVar1;
    if (bVar4) {
      auVar23._8_4_ = iVar20;
      auVar23._0_8_ = auVar18._0_8_;
      auVar23._12_4_ = auVar24._4_4_;
      auVar17._4_4_ = auVar24._0_4_;
      auVar17._0_4_ = iVar16;
      auVar26._8_4_ = iVar8;
      auVar26._0_8_ = auVar6._0_8_;
      auVar26._12_4_ = auVar12._4_4_;
      auVar17._12_4_ = auVar12._0_4_;
      auVar17._8_4_ = iVar5;
      auVar19._0_8_ = CONCAT44(auVar24._8_4_,auVar18._8_4_);
      auVar19._8_4_ = auVar18._12_4_;
      auVar19._12_4_ = auVar24._12_4_;
      auVar7._0_8_ = CONCAT44(auVar12._8_4_,auVar6._8_4_);
      auVar7._8_4_ = auVar6._12_4_;
      auVar7._12_4_ = auVar12._12_4_;
      auVar24._8_8_ = auVar26._8_8_;
      auVar24._0_8_ = auVar23._8_8_;
      auVar6._8_8_ = auVar7._0_8_;
      auVar6._0_8_ = auVar19._0_8_;
      auVar12._8_8_ = auVar7._8_8_;
      auVar12._0_8_ = auVar19._8_8_;
    }
  }
  packssdw(auVar17,auVar24);
  packssdw(auVar6,auVar12);
  alVar30[0] = (ulong)(uint)bd;
  alVar30[1] = (longlong)dest8;
  puVar3 = dest8;
  alVar30 = highbd_clamp_epi16(alVar30,stride);
  u[0] = (ulong)(uint)bd;
  u[1] = (longlong)puVar3;
  highbd_clamp_epi16(u,(int)alVar30[1]);
  *(undefined8 *)((long)dest8 * 2) = extraout_XMM0_Qa;
  *(undefined8 *)((long)stride * 2 + (long)dest8 * 2) = extraout_XMM0_Qb;
  *(undefined8 *)((long)(stride * 2) * 2 + (long)dest8 * 2) = extraout_XMM0_Qa_00;
  *(undefined8 *)((long)(stride * 3) * 2 + (long)dest8 * 2) = extraout_XMM0_Qb_00;
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_sse4_1(const tran_low_t *input, uint8_t *dest8,
                                      int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  __m128i op[4];
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  load_buffer_4x4(input, op);

  // Shift before-hand.
  op[0] = _mm_srai_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_srai_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_srai_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_srai_epi32(op[3], UNIT_QUANT_SHIFT);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i c1 = op[1];
    __m128i d1 = op[2];
    __m128i b1 = op[3];
    a1 = _mm_add_epi32(a1, c1);          // a1 += c1
    d1 = _mm_sub_epi32(d1, b1);          // d1 -= b1
    __m128i e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, b1);  // a1 -= b1
    d1 = _mm_add_epi32(d1, c1);  // d1 += c1

    op[0] = a1;
    op[1] = b1;
    op[2] = c1;
    op[3] = d1;
    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  // Convert to int16_t. The C code checks that we are in range.
  op[0] = _mm_packs_epi32(op[0], op[1]);
  op[1] = _mm_packs_epi32(op[2], op[3]);

  // Load uint16_t.
  __m128i dst[2];
  __m128i tmp[4];
  tmp[0] = _mm_loadl_epi64((const __m128i *)(dest + 0 * stride));
  tmp[1] = _mm_loadl_epi64((const __m128i *)(dest + 1 * stride));
  dst[0] = _mm_unpacklo_epi64(tmp[0], tmp[1]);
  tmp[2] = _mm_loadl_epi64((const __m128i *)(dest + 2 * stride));
  tmp[3] = _mm_loadl_epi64((const __m128i *)(dest + 3 * stride));
  dst[1] = _mm_unpacklo_epi64(tmp[2], tmp[3]);

  // Add to the previous results.
  dst[0] = _mm_add_epi16(dst[0], op[0]);
  dst[1] = _mm_add_epi16(dst[1], op[1]);

  // Clamp.
  dst[0] = highbd_clamp_epi16(dst[0], bd);
  dst[1] = highbd_clamp_epi16(dst[1], bd);

  // Store.
  _mm_storel_epi64((__m128i *)(dest + 0 * stride), dst[0]);
  dst[0] = _mm_srli_si128(dst[0], 8);
  _mm_storel_epi64((__m128i *)(dest + 1 * stride), dst[0]);
  _mm_storel_epi64((__m128i *)(dest + 2 * stride), dst[1]);
  dst[1] = _mm_srli_si128(dst[1], 8);
  _mm_storel_epi64((__m128i *)(dest + 3 * stride), dst[1]);
}